

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall soul::heart::FunctionCall::~FunctionCall(FunctionCall *this)

{
  pool_ref<soul::heart::Expression> *ppVar1;
  
  (this->super_Assignment).super_Statement.super_Object._vptr_Object =
       (_func_int **)&PTR__FunctionCall_003073d8;
  (this->arguments).numActive = 0;
  if (4 < (this->arguments).numAllocated) {
    ppVar1 = (this->arguments).items;
    if (ppVar1 != (pool_ref<soul::heart::Expression> *)0x0) {
      operator_delete__(ppVar1);
    }
    (this->arguments).items = (pool_ref<soul::heart::Expression> *)(this->arguments).space;
    (this->arguments).numAllocated = 4;
  }
  Object::~Object((Object *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

FunctionCall (CodeLocation l, pool_ptr<Expression> dest, pool_ptr<Function> f)
            : Assignment (std::move (l), dest), function (f)
        {
        }